

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

Expr * __thiscall
SQCompilation::CheckerVisitor::maybeEval
          (CheckerVisitor *this,Expr *e,int32_t *evalId,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited,bool allow_external)

{
  iterator iVar1;
  ValueRef *pVVar2;
  Expr *e_00;
  Expr *local_30;
  
  local_30 = e;
  iVar1 = std::
          _Hashtable<const_SQCompilation::Expr_*,_const_SQCompilation::Expr_*,_std::allocator<const_SQCompilation::Expr_*>,_std::__detail::_Identity,_std::equal_to<const_SQCompilation::Expr_*>,_std::hash<const_SQCompilation::Expr_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&visited->_M_h,&local_30);
  if (iVar1.super__Node_iterator_base<const_SQCompilation::Expr_*,_false>._M_cur ==
      (__node_type *)0x0) {
    std::
    _Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<SQCompilation::Expr_const*&>
              ((_Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)visited,&local_30);
    for (; local_30 != (Expr *)0x0;
        local_30 = (Expr *)local_30[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
      if ((local_30->super_Node)._op != TO_PAREN) goto LAB_00156f13;
    }
    local_30 = (Expr *)0x0;
LAB_00156f13:
    pVVar2 = findValueForExpr(this,local_30);
    if ((pVVar2 != (ValueRef *)0x0) &&
       (*evalId = pVVar2->evalIndex, pVVar2->state - VRS_EXPRESSION < 2)) {
      e_00 = pVVar2->expression;
      if (!allow_external) {
        if (e_00 == (Expr *)0x0) {
          e_00 = (Expr *)0x0;
        }
        else if ((e_00->super_Node)._op == TO_EXTERNAL_VALUE) {
          return local_30;
        }
      }
      local_30 = maybeEval(this,e_00,evalId,visited,allow_external);
    }
  }
  return local_30;
}

Assistant:

const Expr *CheckerVisitor::maybeEval(const Expr *e, int32_t &evalId, std::unordered_set<const Expr *> &visited, bool allow_external) {

  if (visited.find(e) != visited.end())
    return e;

  visited.emplace(e);

  e = deparen(e);
  const ValueRef *v = findValueForExpr(e);

  if (!v) {
    return e;
  }

  evalId = v->evalIndex;
  if (v->hasValue()) {
    if (!allow_external && v->expression && v->expression->op() == TO_EXTERNAL_VALUE)
      return e;
    return maybeEval(v->expression, evalId, visited, allow_external);
  }
  else {
    return e;
  }
}